

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BOOL FreeLibrary(HMODULE hLibModule)

{
  BOOL BVar1;
  BOOL retval;
  HMODULE hLibModule_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = LOADFreeLibrary((MODSTRUCT *)hLibModule,1);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return BVar1;
}

Assistant:

BOOL
PALAPI
FreeLibrary(
    IN OUT HMODULE hLibModule)
{
    BOOL retval = FALSE;

    PERF_ENTRY(FreeLibrary);
    ENTRY("FreeLibrary (hLibModule=%p)\n", hLibModule);
    retval = LOADFreeLibrary((MODSTRUCT *)hLibModule, TRUE /* fCallDllMain */);

    LOGEXIT("FreeLibrary returns BOOL %d\n", retval);
    PERF_EXIT(FreeLibrary);
    return retval;
}